

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_casts.cpp
# Opt level: O3

unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true> __thiscall
duckdb::EnumBoundCastData::Copy(EnumBoundCastData *this)

{
  _func_int **pp_Var1;
  long in_RSI;
  BoundCastInfo local_40;
  BoundCastInfo local_28;
  
  BoundCastInfo::Copy(&local_28,(BoundCastInfo *)(in_RSI + 8));
  BoundCastInfo::Copy(&local_40,(BoundCastInfo *)(in_RSI + 0x20));
  pp_Var1 = (_func_int **)operator_new(0x38);
  pp_Var1[1] = (_func_int *)local_28.function;
  pp_Var1[2] = (_func_int *)local_28.init_local_state;
  pp_Var1[4] = (_func_int *)local_40.function;
  pp_Var1[5] = (_func_int *)local_40.init_local_state;
  *pp_Var1 = (_func_int *)&PTR__EnumBoundCastData_0243ca58;
  ((tuple<duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_> *)(pp_Var1 + 3))->
  super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_> =
       (_Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>)
       local_28.cast_data.
       super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
       super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
  ((tuple<duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_> *)(pp_Var1 + 6))->
  super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_> =
       (_Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>)
       local_40.cast_data.
       super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>.
       super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
  (this->super_BoundCastData)._vptr_BoundCastData = pp_Var1;
  return (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)
         (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>)this;
}

Assistant:

unique_ptr<BoundCastData> Copy() const override {
		return make_uniq<EnumBoundCastData>(to_varchar_cast.Copy(), from_varchar_cast.Copy());
	}